

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

void deqp::ub::anon_unknown_1::generateCompareSrc
               (ostringstream *src,char *resultVar,ShaderInterface *interface,UniformLayout *layout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *blockPointers,bool isVertex)

{
  long lVar1;
  long lVar2;
  UniformLayout *layout_00;
  _Alloc_hider type;
  const_iterator cVar3;
  long lVar4;
  undefined8 *puVar5;
  char *__s;
  byte bVar6;
  uint uVar7;
  undefined8 *puVar8;
  undefined4 in_stack_fffffffffffffebc;
  deUint32 in_stack_fffffffffffffec0;
  int activeBlockNdx;
  int local_134;
  undefined8 *local_130;
  uint local_124;
  int local_120;
  int local_11c;
  UniformLayout *local_118;
  string srcPrefix;
  string local_d0;
  string blockInstanceName;
  string apiPrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string instancePostfix;
  
  bVar6 = (byte)blockPointers ^ 1;
  uVar7 = (uint)bVar6 * 0x400 + 0x400;
  local_124 = (uint)bVar6 * 0x100 + 0x100;
  lVar4 = 0;
  local_118 = (UniformLayout *)interface;
  while( true ) {
    if ((int)((ulong)(*(long *)(resultVar + 0x20) - *(long *)(resultVar + 0x18)) >> 3) <= lVar4)
    break;
    local_130 = *(undefined8 **)(*(long *)(resultVar + 0x18) + lVar4 * 8);
    if ((*(uint *)((long)local_130 + 0x5c) & local_124) != 0) {
      lVar1 = local_130[5];
      lVar2 = local_130[4];
      local_120 = *(int *)(local_130 + 0xb);
      local_11c = 1;
      if (0 < local_120) {
        local_11c = local_120;
      }
      if (lVar2 != 0 && lVar1 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&instancePostfix,(char *)*local_130,
                   (allocator<char> *)&blockInstanceName);
        std::operator+(&apiPrefix,&instancePostfix,".");
        std::__cxx11::string::~string((string *)&instancePostfix);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&apiPrefix,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&instancePostfix);
      }
      local_134 = 0;
      while( true ) {
        if (local_11c <= local_134) break;
        if (local_120 < 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&instancePostfix,glcts::fixed_sample_locations_values + 1,
                     (allocator<char> *)&blockInstanceName);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcPrefix,"[",(allocator<char> *)&local_70);
          de::toString<int>(&local_d0,&local_134);
          std::operator+(&blockInstanceName,&srcPrefix,&local_d0);
          std::operator+(&instancePostfix,&blockInstanceName,"]");
          std::__cxx11::string::~string((string *)&blockInstanceName);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&srcPrefix);
        }
        std::operator+(&blockInstanceName,(char *)*local_130,&instancePostfix);
        puVar8 = local_130;
        if (lVar2 != 0 && lVar1 != 0) {
          __s = (char *)local_130[5];
          if (__s != (char *)0x0) {
            __s = (char *)local_130[4];
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,__s,(allocator<char> *)&activeBlockNdx);
          std::operator+(&local_d0,&local_70,&instancePostfix);
          std::operator+(&srcPrefix,&local_d0,".");
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_70);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcPrefix,glcts::fixed_sample_locations_values + 1,
                     (allocator<char> *)&local_d0);
          puVar8 = local_130;
        }
        activeBlockNdx = UniformLayout::getBlockIndex(local_118,blockInstanceName._M_dataplus._M_p);
        cVar3 = std::
                _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                ::find((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                        *)layout,&activeBlockNdx);
        layout_00 = (UniformLayout *)cVar3._M_node[1]._M_parent;
        for (puVar5 = (undefined8 *)puVar8[8]; puVar5 != (undefined8 *)puVar8[9];
            puVar5 = puVar5 + 8) {
          if ((*(uint *)(puVar5 + 7) & uVar7) == 0) {
            std::operator+(&local_d0,&srcPrefix,(char *)*puVar5);
            type._M_p = local_d0._M_dataplus._M_p;
            std::operator+(&local_70,&apiPrefix,(char *)*puVar5);
            generateCompareSrc(src,(char *)(puVar5 + 4),(VarType *)type._M_p,
                               local_70._M_dataplus._M_p,(char *)local_118,layout_00,
                               (void *)CONCAT44(in_stack_fffffffffffffebc,uVar7),
                               in_stack_fffffffffffffec0);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_d0);
            puVar8 = local_130;
          }
        }
        std::__cxx11::string::~string((string *)&srcPrefix);
        std::__cxx11::string::~string((string *)&blockInstanceName);
        std::__cxx11::string::~string((string *)&instancePostfix);
        local_134 = local_134 + 1;
      }
      std::__cxx11::string::~string((string *)&apiPrefix);
    }
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

void generateCompareSrc(std::ostringstream& src, const char* resultVar, const ShaderInterface& interface,
						const UniformLayout& layout, const std::map<int, void*>& blockPointers, bool isVertex)
{
	deUint32 unusedMask = isVertex ? UNUSED_VERTEX : UNUSED_FRAGMENT;

	for (int blockNdx = 0; blockNdx < interface.getNumUniformBlocks(); blockNdx++)
	{
		const UniformBlock& block = interface.getUniformBlock(blockNdx);

		if ((block.getFlags() & (isVertex ? DECLARE_VERTEX : DECLARE_FRAGMENT)) == 0)
			continue; // Skip.

		bool		hasInstanceName = block.getInstanceName() != DE_NULL;
		bool		isArray			= block.isArray();
		int			numInstances	= isArray ? block.getArraySize() : 1;
		std::string apiPrefix		= hasInstanceName ? string(block.getBlockName()) + "." : string("");

		DE_ASSERT(!isArray || hasInstanceName);

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::string instancePostfix   = isArray ? string("[") + de::toString(instanceNdx) + "]" : string("");
			std::string blockInstanceName = block.getBlockName() + instancePostfix;
			std::string srcPrefix =
				hasInstanceName ? string(block.getInstanceName()) + instancePostfix + "." : string("");
			int   activeBlockNdx = layout.getBlockIndex(blockInstanceName.c_str());
			void* basePtr		 = blockPointers.find(activeBlockNdx)->second;

			for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
			{
				const Uniform& uniform = *uniformIter;

				if (uniform.getFlags() & unusedMask)
					continue; // Don't read from that uniform.

				generateCompareSrc(src, resultVar, uniform.getType(), (srcPrefix + uniform.getName()).c_str(),
								   (apiPrefix + uniform.getName()).c_str(), layout, basePtr, unusedMask);
			}
		}
	}
}